

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O1

bool __thiscall
ADSBHubConnection::StreamProcessDataSBS(ADSBHubConnection *this,size_t num,char *buffer)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pEnd;
  
  pcVar3 = (char *)memchr(buffer,10,num);
  do {
    pEnd = pcVar3;
    if (pEnd == (char *)0x0) {
      if (num == 0) {
        ProcessPlaneData(this);
      }
      else {
        std::__cxx11::string::append((char *)&this->lnLeftOver,(ulong)buffer);
      }
      (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[9])
                (this);
      break;
    }
    if ((this->lnLeftOver)._M_string_length == 0) {
      bVar1 = StreamProcessDataSBSLine(this,buffer,pEnd);
      if ((bVar1) ||
         (iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                    _vptr_LTChannel[8])(this), (char)iVar2 != '\0')) goto LAB_0014bc36;
LAB_0014bc66:
      bVar1 = false;
      pcVar3 = pEnd;
    }
    else {
      std::__cxx11::string::append((char *)&this->lnLeftOver,(ulong)buffer);
      pcVar3 = (this->lnLeftOver)._M_dataplus._M_p;
      bVar1 = StreamProcessDataSBSLine
                        (this,pcVar3,pcVar3 + ((this->lnLeftOver)._M_string_length - 1));
      if ((!bVar1) &&
         (iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                    _vptr_LTChannel[8])(this), (char)iVar2 == '\0')) {
        (this->lnLeftOver)._M_string_length = 0;
        *(this->lnLeftOver)._M_dataplus._M_p = '\0';
        goto LAB_0014bc66;
      }
      (this->lnLeftOver)._M_string_length = 0;
      *(this->lnLeftOver)._M_dataplus._M_p = '\0';
LAB_0014bc36:
      num = num - (long)(pEnd + (1 - (long)buffer));
      buffer = pEnd + 1;
      pcVar3 = (char *)memchr(buffer,10,num);
      bVar1 = true;
    }
  } while (bVar1);
  return pEnd == (char *)0x0;
}

Assistant:

bool ADSBHubConnection::StreamProcessDataSBS (size_t num, const char* buffer)
{
    // reading pointer into buffer: beginning and end of a line
    const char* pStart = buffer;            // beginning of a line
    const char* pEnd = (const char*)std::memchr(pStart, '\n', num);
    
    // Loop for all complete lines found
    while (pEnd)
    {
        const size_t len = size_t(pEnd-pStart +1);
        
        // Any left overs from previous message?
        if (!lnLeftOver.empty()) {
            lnLeftOver.append(pStart, len);
            if (!StreamProcessDataSBSLine(lnLeftOver.c_str(), lnLeftOver.c_str() + lnLeftOver.length() -1) &&
                !IncErrCnt())
            {
                lnLeftOver.clear();     // too many errors, bail
                return false;
            }
            lnLeftOver.clear();         // left overs now processed
        }
        // Process full line directly from received data
        else {
            if (!StreamProcessDataSBSLine(pStart, pEnd) &&
                !IncErrCnt())
                return false;           // too many errors, bail
        }
        // Advance to next line in the data
        num -= len;                     // have processed `len` chars
        pStart = pEnd + 1;              // next line starts _after_ the CR
        pEnd = (const char*)std::memchr(pStart, '\n', num);
    }
    
    // Any left overs? Save for later
    if (num > 0)
        lnLeftOver.append(pStart, num);
    else
        // If the entire network message _exactly_ ended with a full line then assume we're done completely and also process that last plane data
        ProcessPlaneData();
    
    // Success
    DecErrCnt();                        // reduce error counter with each fully processed message
    return true;
}